

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserStates.h
# Opt level: O0

void __thiscall gurkenlaeufer::ScenarioState::finish(ScenarioState *this)

{
  element_type *peVar1;
  Scenario local_60;
  ScenarioState *local_10;
  ScenarioState *this_local;
  
  local_10 = this;
  peVar1 = std::
           __shared_ptr_access<gurkenlaeufer::IScenarioCollection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<gurkenlaeufer::IScenarioCollection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_scenarioCollection);
  Scenario::Scenario(&local_60,&this->_scenario);
  (*peVar1->_vptr_IScenarioCollection[2])(peVar1,&local_60);
  Scenario::~Scenario(&local_60);
  return;
}

Assistant:

void finish() override {
        _scenarioCollection->appendScenario(std::move(_scenario));
    }